

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void analyseModelBounds(HighsLogOptions *log_options,char *message,HighsInt numBd,
                       vector<double,_std::allocator<double>_> *lower,
                       vector<double,_std::allocator<double>_> *upper)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  int iVar6;
  
  if (numBd != 0) {
    uVar10 = 0;
    uVar9 = 0;
    if (0 < numBd) {
      uVar9 = (ulong)(uint)numBd;
    }
    local_5c = 0;
    local_60 = 0;
    uVar8 = 0;
    local_50 = 0;
    local_58 = 0;
    while( true ) {
      iVar7 = (int)uVar8;
      iVar5 = (int)local_50;
      iVar6 = (int)local_58;
      if (uVar9 == uVar10) break;
      bVar3 = highs_isInfinity(-(lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                .super__Vector_impl_data._M_start[uVar10]);
      bVar4 = highs_isInfinity((upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
      if (bVar3) {
        if (bVar4) {
          local_5c = local_5c + 1;
        }
        else {
          uVar8 = (ulong)(iVar7 + 1);
        }
      }
      else if (bVar4) {
        local_60 = local_60 + 1;
      }
      else {
        dVar2 = (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        pdVar1 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
        if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
          local_58 = (ulong)(iVar6 + 1);
        }
        else {
          local_50 = (ulong)(iVar5 + 1);
        }
      }
      uVar10 = uVar10 + 1;
    }
    highsLogDev(log_options,kInfo,"Analysing %d %s bounds\n",(ulong)(uint)numBd,message);
    if (0 < (int)local_5c) {
      highsLogDev(log_options,kInfo,"   Free:  %7d (%3d%%)\n",(ulong)local_5c,
                  (long)(int)(local_5c * 100) / (long)numBd & 0xffffffff);
    }
    if (0 < (int)local_60) {
      highsLogDev(log_options,kInfo,"   LB:    %7d (%3d%%)\n",(ulong)local_60,
                  (long)(int)(local_60 * 100) / (long)numBd & 0xffffffff);
    }
    if (0 < iVar7) {
      highsLogDev(log_options,kInfo,"   UB:    %7d (%3d%%)\n",uVar8,
                  (long)(iVar7 * 100) / (long)numBd & 0xffffffff);
    }
    if (0 < iVar5) {
      highsLogDev(log_options,kInfo,"   Boxed: %7d (%3d%%)\n",local_50,
                  (long)(iVar5 * 100) / (long)numBd & 0xffffffff);
    }
    if (0 < iVar6) {
      highsLogDev(log_options,kInfo,"   Fixed: %7d (%3d%%)\n",local_58,
                  (long)(iVar6 * 100) / (long)numBd & 0xffffffff);
    }
    highsLogDev(log_options,kInfo,"grep_CharMl,%s,Free,LB,UB,Boxed,Fixed\n",message);
    highsLogDev(log_options,kInfo,"grep_CharMl,%d,%d,%d,%d,%d,%d\n",(ulong)(uint)numBd,
                (ulong)local_5c,(ulong)local_60,uVar8,local_50,local_58);
  }
  return;
}

Assistant:

void analyseModelBounds(const HighsLogOptions& log_options, const char* message,
                        HighsInt numBd, const std::vector<double>& lower,
                        const std::vector<double>& upper) {
  if (numBd == 0) return;
  HighsInt numFr = 0;
  HighsInt numLb = 0;
  HighsInt numUb = 0;
  HighsInt numBx = 0;
  HighsInt numFx = 0;
  for (HighsInt ix = 0; ix < numBd; ix++) {
    if (highs_isInfinity(-lower[ix])) {
      // Infinite lower bound
      if (highs_isInfinity(upper[ix])) {
        // Infinite lower bound and infinite upper bound: Fr
        numFr++;
      } else {
        // Infinite lower bound and   finite upper bound: Ub
        numUb++;
      }
    } else {
      // Finite lower bound
      if (highs_isInfinity(upper[ix])) {
        // Finite lower bound and infinite upper bound: Lb
        numLb++;
      } else {
        // Finite lower bound and   finite upper bound:
        if (lower[ix] < upper[ix]) {
          // Distinct finite bounds: Bx
          numBx++;
        } else {
          // Equal finite bounds: Fx
          numFx++;
        }
      }
    }
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "Analysing %" HIGHSINT_FORMAT " %s bounds\n", numBd, message);
  if (numFr > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Free:  %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numFr, (100 * numFr) / numBd);
  if (numLb > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   LB:    %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numLb, (100 * numLb) / numBd);
  if (numUb > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   UB:    %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numUb, (100 * numUb) / numBd);
  if (numBx > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Boxed: %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numBx, (100 * numBx) / numBd);
  if (numFx > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Fixed: %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numFx, (100 * numFx) / numBd);
  highsLogDev(log_options, HighsLogType::kInfo,
              "grep_CharMl,%s,Free,LB,UB,Boxed,Fixed\n", message);
  highsLogDev(log_options, HighsLogType::kInfo,
              "grep_CharMl,%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT
              ",%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT
              ",%" HIGHSINT_FORMAT "\n",
              numBd, numFr, numLb, numUb, numBx, numFx);
}